

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

int __thiscall CImage::Load(CImage *this,char *szFilename)

{
  char *__s1;
  int local_2c;
  int nNotTGA;
  char *szExt;
  int nRes;
  char *szFilename_local;
  CImage *this_local;
  
  if (szFilename == (char *)0x0) {
    szExt._4_4_ = 0x3c;
  }
  else {
    __s1 = strrchr(szFilename,0x2e);
    local_2c = 1;
    if (__s1 != (char *)0x0) {
      local_2c = strcasecmp(__s1,".tga");
    }
    if (local_2c == 0) {
      szExt._4_4_ = LoadTga(this,szFilename);
    }
    else {
      szExt._4_4_ = LoadBmp(this,szFilename);
    }
  }
  return szExt._4_4_;
}

Assistant:

int DLL CImage::Load(char *szFilename)
{
  int nRes = 0;

  if ( szFilename != NULL ) 
  {
    char * szExt = strrchr( szFilename, '.' );
    int nNotTGA = 1;

    if ( szExt != NULL ) 
      nNotTGA = _stricmp( szExt, ".tga" );

    if ( nNotTGA != 0 )
      nRes = LoadBmp( szFilename );
    else
      nRes = LoadTga( szFilename );
  }
  else
    nRes = eLoadFilename;

  return nRes;
}